

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O2

ssize_t __thiscall cppcms::json::value::write(value *this,int __fd,void *__buf,size_t __n)

{
  ssize_t sVar1;
  undefined4 in_register_00000034;
  ostream *out;
  locale original;
  locale alStack_48 [8];
  locale local_40 [8];
  locale local_38 [16];
  locale local_28 [8];
  
  out = (ostream *)CONCAT44(in_register_00000034,__fd);
  std::locale::locale(alStack_48,(locale *)(out + *(long *)(*(long *)out + -0x18) + 0xd0));
  std::locale::locale(local_40,"C");
  std::ios::imbue(local_28);
  std::locale::~locale(local_28);
  std::locale::~locale(local_40);
  write_value(this,out,(int)__buf);
  std::ios::imbue(local_38);
  std::locale::~locale(local_38);
  sVar1 = std::locale::~locale(alStack_48);
  return sVar1;
}

Assistant:

void value::write(std::ostream &out,int tabs) const
	{
		std::locale original(out.getloc());
		out.imbue(std::locale("C"));
		try {
			write_value(out,tabs);
		}
		catch(...) {
			out.imbue(original);
			throw;
		}
		out.imbue(original);

	}